

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsExecuter.h
# Opt level: O2

bool __thiscall Refal2::COperationsExecuter::matchRightBegin_V(COperationsExecuter *this)

{
  bool bVar1;
  
  bVar1 = shiftRight(this);
  if (bVar1) {
    if (((this->right->super_CUnit).type & UT_RightParen) != 0) {
      this->right = (CUnitNode *)(this->right->super_CUnit).field_1;
    }
    this->operation = this->operation->next;
    saveState(this);
  }
  return bVar1;
}

Assistant:

inline bool COperationsExecuter::matchRightBegin_V()
{
	if( shiftRight() ) {
		if( right->IsRightParen() ) {
			right = right->PairedParen();
		}
		nextOperation();
		saveState();
		return true;
	} else {
		return false;
	}
}